

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,ForeverLoopStatement *stmt)

{
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RDI;
  type oldBreakStates;
  Statement *other;
  DataFlowAnalysis *in_stack_fffffffffffffde8;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffffec0;
  DataFlowState *in_stack_fffffffffffffec8;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffed0;
  
  other = (Statement *)&in_RDI->breakStates;
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)in_RDI,
             (SmallVector<slang::analysis::DataFlowState,_2UL> *)other);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            ((SmallVectorBase<slang::analysis::DataFlowState> *)in_RDI);
  visit<slang::ast::Statement>(in_RDI,other);
  DataFlowAnalysis::unreachableState(in_stack_fffffffffffffde8);
  loopTail(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  DataFlowState::~DataFlowState((DataFlowState *)0x8254f1);
  SmallVector<slang::analysis::DataFlowState,_2UL>::~SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)0x8254fe);
  return;
}

Assistant:

void visitStmt(const ForeverLoopStatement& stmt) {
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        // The exit state is by default unreachable but
        // if there are break statements that could change.
        loopTail((DERIVED).unreachableState(), std::move(oldBreakStates));
    }